

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_posix::create_parsing
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (type == 2) {
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
    create_parsing_impl<wchar_t>(this,in,(shared_ptr<__locale_struct_*> *)&local_40);
    p_Var1 = &local_40;
  }
  else {
    if (type != 1) {
      std::locale::locale((locale *)this,in);
      return (locale)(_Impl *)this;
    }
    std::__shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>);
    create_parsing_impl<char>(this,in,(shared_ptr<__locale_struct_*> *)&local_30);
    p_Var1 = &local_30;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_parsing( std::locale const &in,
                            booster::shared_ptr<locale_t> lc,
                            character_facet_type type)
{
        switch(type) {
        case char_facet: 
            return create_parsing_impl<char>(in,lc);
        case wchar_t_facet:
            return create_parsing_impl<wchar_t>(in,lc);
        default:
            return in;
        }
}